

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O3

void UpdateThumbVFPPredicate(cs_struct *ud,MCInst *MI)

{
  ushort uVar1;
  _Bool _Var2;
  uint uVar3;
  MCOperand *pMVar4;
  uint uVar5;
  ulong uVar6;
  MCOperandInfo *m;
  
  uVar3 = (ud->ITBlock).size;
  if (uVar3 == 0) {
    uVar5 = 0xe;
  }
  else {
    uVar3 = uVar3 - 1;
    uVar5 = (uint)(ud->ITBlock).ITStates[uVar3];
    (ud->ITBlock).size = uVar3;
  }
  uVar3 = MCInst_getOpcode(MI);
  m = ARMInsts[uVar3].OpInfo;
  uVar3 = MCInst_getOpcode(MI);
  uVar1 = ARMInsts[uVar3].NumOperands;
  if ((ulong)uVar1 != 0) {
    uVar6 = 0;
    do {
      _Var2 = MCOperandInfo_isPredicate(m);
      if (_Var2) {
        pMVar4 = MCInst_getOperand(MI,(uint)uVar6);
        MCOperand_setImm(pMVar4,(ulong)uVar5);
        pMVar4 = MCInst_getOperand(MI,(uint)uVar6 + 1);
        MCOperand_setReg(pMVar4,(uint)(uVar5 != 0xe) * 3);
        return;
      }
      uVar6 = uVar6 + 1;
      m = m + 1;
    } while (uVar1 != uVar6);
  }
  return;
}

Assistant:

static void UpdateThumbVFPPredicate(cs_struct *ud, MCInst *MI)
{
	unsigned CC;
	unsigned short NumOps;
	MCOperandInfo *OpInfo;
	unsigned i;

	CC = ITStatus_getITCC(&(ud->ITBlock));
	if (ITStatus_instrInITBlock(&(ud->ITBlock)))
		ITStatus_advanceITState(&(ud->ITBlock));

	OpInfo = ARMInsts[MCInst_getOpcode(MI)].OpInfo;
	NumOps = ARMInsts[MCInst_getOpcode(MI)].NumOperands;

	for (i = 0; i < NumOps; ++i) {
		if (MCOperandInfo_isPredicate(&OpInfo[i])) {
			MCOperand_setImm(MCInst_getOperand(MI, i), CC);
			if (CC == ARMCC_AL)
				MCOperand_setReg(MCInst_getOperand(MI, i+1), 0);
			else
				MCOperand_setReg(MCInst_getOperand(MI, i+1), ARM_CPSR);
			return;
		}
	}
}